

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void dereference_suite::get_boolean(void)

{
  index_type *piVar1;
  type tVar2;
  reference pbVar3;
  const_reference pbVar4;
  bool local_b2;
  bool local_b1;
  undefined1 local_b0 [8];
  const_iterator where_1;
  variable data_1;
  bool local_5e;
  bool local_5d [13];
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  piVar1 = &where.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)piVar1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::value
                     ((iterator *)local_50);
  local_5d[0] = true;
  tVar2 = trial::dynamic::operator==(pbVar3,local_5d);
  boost::detail::test_impl
            ("where.value() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x711,"void dereference_suite::get_boolean()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_50);
  local_5e = true;
  tVar2 = trial::dynamic::operator==(pbVar3,&local_5e);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x712,"void dereference_suite::get_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)piVar1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((const_iterator *)local_b0,(basic_variable<std::allocator<char>_> *)piVar1);
  pbVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::value
                     ((const_iterator *)local_b0);
  local_b1 = true;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_b1);
  boost::detail::test_impl
            ("where.value() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x717,"void dereference_suite::get_boolean()",tVar2);
  pbVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_b0);
  local_b2 = true;
  tVar2 = trial::dynamic::operator==(pbVar4,&local_b2);
  boost::detail::test_impl
            ("*where == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x718,"void dereference_suite::get_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void get_boolean()
{
    {
        variable data(true);
        variable::iterator where = data.begin();
        TRIAL_PROTOCOL_TEST(where.value() == true);
        TRIAL_PROTOCOL_TEST(*where == true);
    }
    {
        const variable data(true);
        variable::const_iterator where = data.begin();
        TRIAL_PROTOCOL_TEST(where.value() == true);
        TRIAL_PROTOCOL_TEST(*where == true);
    }
}